

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O2

void __thiscall
QPDF::insertPageobjToPage(QPDF *this,QPDFObjectHandle *obj,int pos,bool check_duplicate)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  QPDFObjGen og_00;
  QPDFExc *this_00;
  string *filename;
  mapped_type *pmVar2;
  undefined7 in_register_00000009;
  _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,int>,std::_Select1st<std::pair<QPDFObjGen_const,int>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
  *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_int>_>,_bool> pVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  QPDFObjGen og;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  og_00 = QPDFObjectHandle::getObjGen(obj);
  this_01 = (_Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,int>,std::_Select1st<std::pair<QPDFObjGen_const,int>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
             *)&((this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pageobj_to_pages_pos;
  og = og_00;
  if ((int)CONCAT71(in_register_00000009,check_duplicate) == 0) {
    pmVar2 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[]((map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                           *)this_01,&og);
    *pmVar2 = pos;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)og_00;
    local_88._M_string_length._0_4_ = pos;
    pVar3 = std::
            _Rb_tree<QPDFObjGen,std::pair<QPDFObjGen_const,int>,std::_Select1st<std::pair<QPDFObjGen_const,int>>,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
            ::_M_emplace_unique<std::pair<QPDFObjGen,int>>
                      (this_01,(pair<QPDFObjGen,_int> *)&local_88);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::to_string(&local_40,pos);
      std::operator+(&local_60,"page ",&local_40);
      std::operator+(&local_88,&local_60," (numbered from zero)");
      setLastObjectDescription(this,&local_88,og_00);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      filename = (string *)
                 (**(code **)(**(long **)&(((this->m)._M_t.
                                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                            .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                           _M_head_impl)->file).
                                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                             + 0x18))();
      _Var1._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"duplicate page reference found; this would cause loss of data"
                 ,(allocator<char> *)&local_60);
      QPDFExc::QPDFExc(this_00,qpdf_e_pages,filename,&(_Var1._M_head_impl)->last_object_description,
                       0,&local_88);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  return;
}

Assistant:

void
QPDF::insertPageobjToPage(QPDFObjectHandle const& obj, int pos, bool check_duplicate)
{
    QPDFObjGen og(obj.getObjGen());
    if (check_duplicate) {
        if (!m->pageobj_to_pages_pos.insert(std::make_pair(og, pos)).second) {
            // The library never calls insertPageobjToPage in a way that causes this to happen.
            setLastObjectDescription("page " + std::to_string(pos) + " (numbered from zero)", og);
            throw QPDFExc(
                qpdf_e_pages,
                m->file->getName(),
                m->last_object_description,
                0,
                "duplicate page reference found; this would cause loss of data");
        }
    } else {
        m->pageobj_to_pages_pos[og] = pos;
    }
}